

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeFramebufferCase::init
          (NegativeFramebufferCase *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  CaseType CVar2;
  int extraout_EAX;
  TestError *this_00;
  NotSupportedError *pNVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  allocator<char> local_79;
  vector<int,_std::allocator<int>_> rboSamples;
  string local_58;
  vector<int,_std::allocator<int>_> textureSamples;
  
  CVar2 = this->m_caseType;
  textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getFormatSamples(this,0x9100,&textureSamples);
  getFormatSamples(this,0x8d41,&rboSamples);
  if (textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"!textureSamples.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
               ,0x64e);
LAB_004d485b:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"!rboSamples.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
               ,0x64f);
    goto LAB_004d485b;
  }
  if (CVar2 < CASE_DIFFERENT_FIXED_TEX) {
    if (CVar2 != CASE_DIFFERENT_N_SAMPLES_TEX) {
      uVar4 = (ulong)((long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      uVar5 = (ulong)((long)rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      uVar7 = 0;
      uVar6 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar6 = uVar7;
      }
      uVar5 = uVar4 & 0xffffffff;
      if ((int)uVar4 < 1) {
        uVar5 = uVar7;
      }
      do {
        if (uVar7 == uVar5) {
          pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Test requires multiple supported sample counts",&local_79)
          ;
          tcu::NotSupportedError::NotSupportedError(pNVar3,&local_58);
          __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        uVar4 = 0;
        while (uVar6 != uVar4) {
          iVar8 = textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7];
          uVar9 = uVar4 + 1;
          piVar1 = rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar4;
          uVar4 = uVar9;
          if (iVar8 != *piVar1) goto LAB_004d47aa;
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    this->m_numSamples0 =
         *textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((ulong)((long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < 5) {
      pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Test requires multiple supported sample counts",&local_79);
      tcu::NotSupportedError::NotSupportedError(pNVar3,&local_58);
      __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    iVar8 = textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[1];
  }
  else {
    if (CVar2 != CASE_DIFFERENT_FIXED_TEX) {
      if (CVar2 == CASE_DIFFERENT_FIXED_RBO) {
        uVar4 = (ulong)((long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        uVar5 = (ulong)((long)rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
        uVar7 = 0;
        uVar6 = uVar5 & 0xffffffff;
        if ((int)uVar5 < 1) {
          uVar6 = uVar7;
        }
        uVar5 = uVar4 & 0xffffffff;
        if ((int)uVar4 < 1) {
          uVar5 = uVar7;
        }
        do {
          if (uVar7 == uVar5) {
            pNVar3 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,
                       "Test requires a sample count supported in both rbo and texture",&local_79);
            tcu::NotSupportedError::NotSupportedError(pNVar3,&local_58);
            __cxa_throw(pNVar3,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          uVar4 = 0;
          while (uVar6 != uVar4) {
            iVar8 = textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
            uVar9 = uVar4 + 1;
            piVar1 = rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar4;
            uVar4 = uVar9;
            if (iVar8 == *piVar1) goto LAB_004d47aa;
          }
          uVar7 = uVar7 + 1;
        } while( true );
      }
      this->m_numSamples0 =
           *textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
      goto LAB_004d47e0;
    }
    iVar8 = *textureSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    this->m_numSamples0 = iVar8;
  }
  goto LAB_004d47da;
LAB_004d47aa:
  this->m_numSamples0 = iVar8;
  iVar8 = rboSamples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9 - 1];
LAB_004d47da:
  this->m_numSamples1 = iVar8;
LAB_004d47e0:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rboSamples.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&textureSamples.super__Vector_base<int,_std::allocator<int>_>);
  return extraout_EAX;
}

Assistant:

void NegativeFramebufferCase::init (void)
{
	const bool				colorAttachmentTexture	= (m_caseType == CASE_DIFFERENT_N_SAMPLES_TEX) || (m_caseType == CASE_DIFFERENT_FIXED_TEX);
	const bool				colorAttachmentRbo		= (m_caseType == CASE_DIFFERENT_N_SAMPLES_RBO) || (m_caseType == CASE_DIFFERENT_FIXED_RBO);
	const bool				useDifferentSampleCounts= (m_caseType == CASE_DIFFERENT_N_SAMPLES_TEX) || (m_caseType == CASE_DIFFERENT_N_SAMPLES_RBO);
	std::vector<int>		textureSamples;
	std::vector<int>		rboSamples;

	getFormatSamples(GL_TEXTURE_2D_MULTISAMPLE, textureSamples);
	getFormatSamples(GL_RENDERBUFFER, rboSamples);

	TCU_CHECK(!textureSamples.empty());
	TCU_CHECK(!rboSamples.empty());

	// select sample counts

	if (useDifferentSampleCounts)
	{
		if (colorAttachmentTexture)
		{
			m_numSamples0 = textureSamples[0];

			if (textureSamples.size() >= 2)
				m_numSamples1 = textureSamples[1];
			else
				throw tcu::NotSupportedError("Test requires multiple supported sample counts");
		}
		else if (colorAttachmentRbo)
		{
			for (int texNdx = 0; texNdx < (int)textureSamples.size(); ++texNdx)
			for (int rboNdx = 0; rboNdx < (int)rboSamples.size(); ++rboNdx)
			{
				if (textureSamples[texNdx] != rboSamples[rboNdx])
				{
					m_numSamples0 = textureSamples[texNdx];
					m_numSamples1 = rboSamples[rboNdx];
					return;
				}
			}

			throw tcu::NotSupportedError("Test requires multiple supported sample counts");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
	else
	{
		if (colorAttachmentTexture)
		{
			m_numSamples0 = textureSamples[0];
			m_numSamples1 = textureSamples[0];
		}
		else if (colorAttachmentRbo)
		{
			for (int texNdx = 0; texNdx < (int)textureSamples.size(); ++texNdx)
			for (int rboNdx = 0; rboNdx < (int)rboSamples.size(); ++rboNdx)
			{
				if (textureSamples[texNdx] == rboSamples[rboNdx])
				{
					m_numSamples0 = textureSamples[texNdx];
					m_numSamples1 = rboSamples[rboNdx];
					return;
				}
			}

			throw tcu::NotSupportedError("Test requires a sample count supported in both rbo and texture");
		}
		else
		{
			m_numSamples0 = textureSamples[0];
		}
	}
}